

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::make_l1_norm
          (quadratic_cost_type<long_double> *this,int n)

{
  int iVar1;
  bool bVar2;
  type piVar3;
  type plVar4;
  type pqVar5;
  unique_ptr<long_double[],_std::default_delete<long_double[]>_> *this_00;
  unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  *this_01;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  int local_3c;
  int e_1;
  int i_3;
  int i_2;
  int e;
  int i_1;
  int i;
  longdouble div;
  int n_local;
  quadratic_cost_type<long_double> *this_local;
  
  _i_1 = (longdouble)0;
  for (e = 0; e != n; e = e + 1) {
    this_00 = &this->linear_elements;
    std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[](this_00,(long)e)
    ;
    std::abs((int)this_00);
    _i_1 = _i_1 + in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
  }
  i_2 = 0;
  piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar1 = *piVar3;
  for (; i_2 != iVar1; i_2 = i_2 + 1) {
    this_01 = &this->quadratic_elements;
    std::
    unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
    ::operator[](this_01,(long)i_2);
    std::abs((int)this_01);
    _i_1 = _i_1 + in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
  }
  bVar2 = std::isnormal(_i_1);
  if (bVar2) {
    for (e_1 = 0; e_1 != n; e_1 = e_1 + 1) {
      plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *plVar4 = *plVar4 / _i_1;
    }
    local_3c = 0;
    piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n)
    ;
    iVar1 = *piVar3;
    for (; local_3c != iVar1; local_3c = local_3c + 1) {
      pqVar5 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_3c);
      pqVar5->factor = pqVar5->factor / _i_1;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }